

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

wasm_module_t * wasm_module_new(wasm_store_t *store,wasm_byte_vec_t *binary)

{
  undefined1 *puVar1;
  size_t size;
  wasm_byte_t *data;
  long lVar2;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar3;
  Result RVar4;
  char *pcVar5;
  wasm_module_t *this;
  pointer __dest;
  size_t __n;
  ulong uVar6;
  Errors errors;
  ModuleDesc module_desc;
  RefPtr<wabt::interp::Module> local_2c8;
  Errors local_2a8;
  undefined1 local_290 [32];
  ModuleDesc local_270;
  ModuleDesc local_150;
  
  local_2a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&local_150,0,0x120);
  size = binary->size;
  data = binary->data;
  wabt::Features::EnableAll(&s_features);
  pcVar5 = getenv("WASM_API_DEBUG");
  uVar3 = s_log_stream;
  if (pcVar5 != (char *)0x0) {
    wabt::FileStream::CreateStderr();
    uVar3._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
    super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl._5_3_ = local_290._5_3_;
    uVar3._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
    super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl._0_5_ = local_290._0_5_;
    local_290[0] = false;
    local_290[1] = false;
    local_290[2] = false;
    local_290[3] = false;
    local_290[4] = false;
    local_290[5] = false;
    local_290[6] = false;
    local_290[7] = false;
    if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
        s_log_stream._M_t.
        super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
        super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
        super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
      lVar2 = *(long *)s_log_stream._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      s_log_stream._M_t.
      super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
      super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
           uVar3._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      (**(code **)(lVar2 + 8))();
      uVar3._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
           s_log_stream._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      if ((long *)CONCAT35(local_290._5_3_,local_290._0_5_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT35(local_290._5_3_,local_290._0_5_) + 8))();
        uVar3 = s_log_stream;
      }
    }
  }
  s_log_stream._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       uVar3._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
       _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  local_290[0] = s_features.exceptions_enabled_;
  local_290[1] = s_features.mutable_globals_enabled_;
  local_290[2] = s_features.sat_float_to_int_enabled_;
  local_290[3] = s_features.sign_extension_enabled_;
  local_290[4] = s_features.simd_enabled_;
  local_290[5] = s_features.threads_enabled_;
  local_290[6] = s_features.multi_value_enabled_;
  local_290[7] = s_features.tail_call_enabled_;
  local_290[8] = s_features.bulk_memory_enabled_;
  local_290[9] = s_features.reference_types_enabled_;
  local_290[10] = s_features.annotations_enabled_;
  local_290[0xb] = s_features.gc_enabled_;
  local_290[0xc] = s_features.memory64_enabled_;
  local_290._16_8_ =
       s_log_stream._M_t.
       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  local_290[0x18] = true;
  local_290[0x19] = true;
  local_290[0x1a] = true;
  RVar4 = wabt::interp::ReadBinaryInterp
                    (data,size,(ReadBinaryOptions *)local_290,&local_2a8,&local_150);
  if (RVar4.enum_ == Error) {
    puVar1 = local_290 + 0x10;
    local_290._0_5_ = SUB85(puVar1,0);
    local_290._5_3_ = (undefined3)((ulong)puVar1 >> 0x28);
    local_290[8] = false;
    local_290[9] = false;
    local_290[10] = false;
    local_290[0xb] = false;
    local_290[0xc] = false;
    local_290._13_3_ = 0;
    local_290._16_8_ = local_290._16_8_ & 0xffffffffffffff00;
    wabt::FormatErrorsToFile
              (&local_2a8,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)local_290,Never,0x50
              );
    if ((undefined1 *)CONCAT35(local_290._5_3_,local_290._0_5_) != puVar1) {
      operator_delete((undefined1 *)CONCAT35(local_290._5_3_,local_290._0_5_));
    }
    this = (wasm_module_t *)0x0;
  }
  else {
    this = (wasm_module_t *)operator_new(0x28);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
              (&local_270.func_types,&local_150.func_types);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
              (&local_270.imports,&local_150.imports);
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
              (&local_270.funcs,&local_150.funcs);
    std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
              (&local_270.tables,&local_150.tables);
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
              (&local_270.memories,&local_150.memories);
    std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
              (&local_270.globals,&local_150.globals);
    std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::vector
              (&local_270.events,&local_150.events);
    std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
              (&local_270.exports,&local_150.exports);
    std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
              (&local_270.starts,&local_150.starts);
    std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
              (&local_270.elems,&local_150.elems);
    std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
              (&local_270.datas,&local_150.datas);
    local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = (long)local_150.istream.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_150.istream.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar6 == 0) {
      __dest = (pointer)0x0;
      __n = 0;
    }
    else {
      if ((long)uVar6 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer)operator_new(uVar6);
      __n = (long)local_150.istream.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_150.istream.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar6;
    local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = __dest;
    if (local_150.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_150.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = __dest;
      memmove(__dest,local_150.istream.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
    }
    local_270.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
    wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
              (&local_2c8,&store->I,&store->I,&local_270);
    wasm_module_t::wasm_module_t(this,&local_2c8,binary);
    if (local_2c8.obj_ != (Module *)0x0) {
      wabt::interp::Store::DeleteRoot(local_2c8.store_,local_2c8.root_index_);
      local_2c8.obj_ = (Module *)0x0;
      local_2c8.store_ = (Store *)0x0;
      local_2c8.root_index_ = 0;
    }
    wabt::interp::ModuleDesc::~ModuleDesc(&local_270);
  }
  wabt::interp::ModuleDesc::~ModuleDesc(&local_150);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_2a8);
  return this;
}

Assistant:

own wasm_module_t* wasm_module_new(wasm_store_t* store,
                                   const wasm_byte_vec_t* binary) {
  Errors errors;
  ModuleDesc module_desc;
  if (Failed(ReadBinaryInterp(binary->data, binary->size, GetOptions(), &errors,
                              &module_desc))) {
    FormatErrorsToFile(errors, Location::Type::Binary);
    return nullptr;
  }

  return new wasm_module_t{Module::New(store->I, module_desc), binary};
}